

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefileTargetGenerator.cxx
# Opt level: O0

void __thiscall
cmMakefileTargetGenerator::AddModuleDefinitionFlag(cmMakefileTargetGenerator *this,string *flags)

{
  cmGeneratorTarget *this_00;
  cmMakefile *pcVar1;
  char *pcVar2;
  ulong uVar3;
  string local_110 [39];
  allocator local_e9;
  string local_e8 [8];
  string flag;
  string local_c0;
  char *local_a0;
  char *defFileFlag;
  allocator local_8d [20];
  allocator local_79;
  string local_78;
  string local_58;
  undefined1 local_38 [8];
  string def;
  string *flags_local;
  cmMakefileTargetGenerator *this_local;
  
  this_00 = this->GeneratorTarget;
  pcVar1 = this->Makefile;
  def.field_2._8_8_ = flags;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_78,"CMAKE_BUILD_TYPE",&local_79);
  pcVar2 = cmMakefile::GetSafeDefinition(pcVar1,&local_78);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_58,pcVar2,local_8d);
  cmGeneratorTarget::GetModuleDefinitionFile((string *)local_38,this_00,&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  std::allocator<char>::~allocator((allocator<char> *)local_8d);
  std::__cxx11::string::~string((string *)&local_78);
  std::allocator<char>::~allocator((allocator<char> *)&local_79);
  uVar3 = std::__cxx11::string::empty();
  if ((uVar3 & 1) == 0) {
    pcVar1 = this->Makefile;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_c0,"CMAKE_LINK_DEF_FILE_FLAG",
               (allocator *)(flag.field_2._M_local_buf + 0xf));
    pcVar2 = cmMakefile::GetDefinition(pcVar1,&local_c0);
    std::__cxx11::string::~string((string *)&local_c0);
    std::allocator<char>::~allocator((allocator<char> *)(flag.field_2._M_local_buf + 0xf));
    local_a0 = pcVar2;
    if (pcVar2 == (char *)0x0) {
      defFileFlag._4_4_ = 1;
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_e8,pcVar2,&local_e9);
      std::allocator<char>::~allocator((allocator<char> *)&local_e9);
      (*(this->LocalGenerator->super_cmLocalGenerator)._vptr_cmLocalGenerator[0xe])
                (local_110,this->LocalGenerator,local_38,2);
      std::__cxx11::string::operator+=(local_e8,local_110);
      std::__cxx11::string::~string(local_110);
      (*(this->LocalGenerator->super_cmLocalGenerator)._vptr_cmLocalGenerator[5])
                (this->LocalGenerator,def.field_2._8_8_,local_e8);
      std::__cxx11::string::~string(local_e8);
      defFileFlag._4_4_ = 0;
    }
  }
  else {
    defFileFlag._4_4_ = 1;
  }
  std::__cxx11::string::~string((string *)local_38);
  return;
}

Assistant:

void cmMakefileTargetGenerator::AddModuleDefinitionFlag(std::string& flags)
{
  std::string def = this->GeneratorTarget->GetModuleDefinitionFile(
                      this->Makefile->GetSafeDefinition("CMAKE_BUILD_TYPE"));
  if(def.empty())
    {
    return;
    }

  // TODO: Create a per-language flag variable.
  const char* defFileFlag =
    this->Makefile->GetDefinition("CMAKE_LINK_DEF_FILE_FLAG");
  if(!defFileFlag)
    {
    return;
    }

  // Append the flag and value.  Use ConvertToLinkReference to help
  // vs6's "cl -link" pass it to the linker.
  std::string flag = defFileFlag;
  flag += (this->LocalGenerator->ConvertToLinkReference(def));
  this->LocalGenerator->AppendFlags(flags, flag);
}